

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

void stbtt__sort_edges_quicksort(stbtt__edge *p,int n)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  stbtt__edge *psVar13;
  stbtt__edge *psVar14;
  uint n_00;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  stbtt__edge *psVar19;
  stbtt__edge t;
  long lVar12;
  
  while (0xc < n) {
    psVar14 = p + ((uint)n >> 1);
    fVar2 = p[(uint)n >> 1].y0;
    uVar17 = (ulong)(n - 1);
    fVar3 = p[uVar17].y0;
    if (fVar2 <= p->y0 == fVar2 < fVar3) {
      uVar10 = uVar17;
      if (fVar3 <= p->y0 != fVar2 < fVar3) {
        uVar10 = 0;
      }
      iVar15 = p[uVar10].invert;
      psVar19 = p + uVar10;
      fVar5 = psVar19->x0;
      fVar6 = psVar19->y0;
      fVar7 = psVar19->x1;
      fVar8 = psVar19->y1;
      p[uVar10].invert = psVar14->invert;
      fVar2 = psVar14->y0;
      fVar3 = psVar14->x1;
      fVar4 = psVar14->y1;
      psVar19 = p + uVar10;
      psVar19->x0 = psVar14->x0;
      psVar19->y0 = fVar2;
      psVar19->x1 = fVar3;
      psVar19->y1 = fVar4;
      psVar14->invert = iVar15;
      psVar14->x0 = fVar5;
      psVar14->y0 = fVar6;
      psVar14->x1 = fVar7;
      psVar14->y1 = fVar8;
    }
    iVar15 = p->invert;
    fVar5 = p->x0;
    fVar6 = p->y0;
    fVar7 = p->x1;
    fVar8 = p->y1;
    p->invert = psVar14->invert;
    fVar2 = psVar14->y0;
    fVar3 = psVar14->x1;
    fVar4 = psVar14->y1;
    p->x0 = psVar14->x0;
    p->y0 = fVar2;
    p->x1 = fVar3;
    p->y1 = fVar4;
    psVar14->invert = iVar15;
    psVar14->x0 = fVar5;
    psVar14->y0 = fVar6;
    psVar14->x1 = fVar7;
    psVar14->y1 = fVar8;
    iVar15 = n + 1;
    lVar11 = 1;
    while( true ) {
      fVar2 = p->y0;
      iVar9 = (int)lVar11;
      n_00 = iVar15 - iVar9;
      lVar11 = (long)iVar9;
      lVar16 = (long)iVar9 * 0x14 + -0x14;
      do {
        lVar18 = lVar16;
        lVar12 = lVar11;
        lVar11 = lVar12 + 1;
        n_00 = n_00 - 1;
        pfVar1 = (float *)((long)&p[1].y0 + lVar18);
        lVar16 = lVar18 + 0x14;
      } while (*pfVar1 <= fVar2 && fVar2 != *pfVar1);
      psVar19 = (stbtt__edge *)((long)&p[1].x0 + lVar18);
      lVar16 = (long)(int)uVar17 + 1;
      psVar14 = p + (long)(int)uVar17 + 1;
      do {
        psVar13 = psVar14;
        lVar16 = lVar16 + -1;
        n = (int)uVar17;
        uVar17 = (ulong)(n - 1);
        psVar14 = psVar13 + -1;
      } while (fVar2 < psVar13[-1].y0);
      if (lVar16 <= lVar12) break;
      iVar9 = psVar19->invert;
      fVar5 = psVar19->x0;
      fVar6 = psVar19->y0;
      fVar7 = psVar19->x1;
      fVar8 = psVar19->y1;
      psVar19->invert = psVar13[-1].invert;
      fVar2 = psVar14->y0;
      fVar3 = psVar13[-1].x1;
      fVar4 = psVar13[-1].y1;
      psVar19->x0 = psVar14->x0;
      psVar19->y0 = fVar2;
      psVar19->x1 = fVar3;
      psVar19->y1 = fVar4;
      psVar13[-1].invert = iVar9;
      psVar14->x0 = fVar5;
      psVar14->y0 = fVar6;
      psVar13[-1].x1 = fVar7;
      psVar13[-1].y1 = fVar8;
    }
    if (n < (int)n_00) {
      stbtt__sort_edges_quicksort(p,n);
      p = psVar19;
      n = n_00;
    }
    else {
      stbtt__sort_edges_quicksort(psVar19,n_00);
    }
  }
  return;
}

Assistant:

static void stbtt__sort_edges_quicksort(stbtt__edge *p, int n)
{
   /* threshold for transitioning to insertion sort */
   while (n > 12) {
      stbtt__edge t;
      int c01,c12,c,m,i,j;

      /* compute median of three */
      m = n >> 1;
      c01 = STBTT__COMPARE(&p[0],&p[m]);
      c12 = STBTT__COMPARE(&p[m],&p[n-1]);
      /* if 0 >= mid >= end, or 0 < mid < end, then use mid */
      if (c01 != c12) {
         /* otherwise, we'll need to swap something else to middle */
         int z;
         c = STBTT__COMPARE(&p[0],&p[n-1]);
         /* 0>mid && mid<n:  0>n => n; 0<n => 0 */
         /* 0<mid && mid>n:  0>n => 0; 0<n => n */
         z = (c == c12) ? 0 : n-1;
         t = p[z];
         p[z] = p[m];
         p[m] = t;
      }
      /* now p[m] is the median-of-three */
      /* swap it to the beginning so it won't move around */
      t = p[0];
      p[0] = p[m];
      p[m] = t;

      /* partition loop */
      i=1;
      j=n-1;
      for(;;) {
         /* handling of equality is crucial here */
         /* for sentinels & efficiency with duplicates */
         for (;;++i) {
            if (!STBTT__COMPARE(&p[i], &p[0])) break;
         }
         for (;;--j) {
            if (!STBTT__COMPARE(&p[0], &p[j])) break;
         }
         /* make sure we haven't crossed */
         if (i >= j) break;
         t = p[i];
         p[i] = p[j];
         p[j] = t;

         ++i;
         --j;
      }
      /* recurse on smaller side, iterate on larger */
      if (j < (n-i)) {
         stbtt__sort_edges_quicksort(p,j);
         p = p+i;
         n = n-i;
      } else {
         stbtt__sort_edges_quicksort(p+i, n-i);
         n = j;
      }
   }
}